

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_fix.cpp
# Opt level: O0

void Omega_h::fix(Mesh *mesh,AdaptOpts *adapt_opts,Omega_h_Isotropy isotropy,bool verbose)

{
  bool local_1e;
  bool verbose_local;
  Omega_h_Isotropy isotropy_local;
  AdaptOpts *adapt_opts_local;
  Mesh *mesh_local;
  
  local_1e = false;
  if (verbose) {
    local_1e = can_print(mesh);
  }
  if (local_1e != false) {
    std::operator<<((ostream *)&std::cout,"Computing bad-mesh \"implied\" metric\n");
  }
  compute_ill_metric(mesh,adapt_opts,isotropy);
  fix_for_given_metric(mesh,adapt_opts,local_1e);
  return;
}

Assistant:

void fix(Mesh* mesh, AdaptOpts const& adapt_opts, Omega_h_Isotropy isotropy,
    bool verbose) {
  verbose = verbose && can_print(mesh);
  if (verbose) std::cout << "Computing bad-mesh \"implied\" metric\n";
  compute_ill_metric(mesh, adapt_opts, isotropy);
  fix_for_given_metric(mesh, adapt_opts, verbose);
  // TODO: commenting this out because metric quality corrections assume
  // isotropy!!! we need to fix this, but for now just skip this step
  if ((0)) {
    if (verbose) std::cout << "Computing more typical \"implied\" metric\n";
    compute_typical_metric(mesh, isotropy);
    fix_for_given_metric(mesh, adapt_opts, verbose);
  }
}